

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

leaf_t * containerptr_roaring64_bitmap_remove
                   (roaring64_bitmap_t *r,uint8_t *high48,uint16_t low16,leaf_t *leaf)

{
  uint8_t typecode;
  container_t *c;
  uint8_t typecode_00;
  _Bool _Var1;
  undefined8 in_RAX;
  container_t *c_00;
  art_val_t *__ptr;
  uint8_t typecode2;
  uint8_t local_31;
  
  local_31 = (uint8_t)((ulong)in_RAX >> 0x38);
  if (leaf != (leaf_t *)0x0) {
    c = leaf->container;
    typecode = leaf->typecode;
    c_00 = container_remove(c,low16,typecode,&local_31);
    typecode_00 = local_31;
    if (c_00 != c) {
      container_free(c,typecode);
      leaf->container = c_00;
      leaf->typecode = local_31;
      typecode_00 = local_31;
    }
    _Var1 = container_nonzero_cardinality(c_00,typecode_00);
    if (_Var1) {
      return leaf;
    }
    container_free(c_00,typecode_00);
    __ptr = art_erase(&r->art,high48);
    if (__ptr != (art_val_t *)0x0) {
      roaring_free(__ptr);
    }
  }
  return (leaf_t *)0x0;
}

Assistant:

static inline leaf_t *containerptr_roaring64_bitmap_remove(
    roaring64_bitmap_t *r, uint8_t *high48, uint16_t low16, leaf_t *leaf) {
    if (leaf == NULL) {
        return NULL;
    }

    container_t *container = leaf->container;
    uint8_t typecode = leaf->typecode;
    uint8_t typecode2;
    container_t *container2 =
        container_remove(container, low16, typecode, &typecode2);
    if (container2 != container) {
        container_free(container, typecode);
        leaf->container = container2;
        leaf->typecode = typecode2;
    }
    if (!container_nonzero_cardinality(container2, typecode2)) {
        container_free(container2, typecode2);
        leaf = (leaf_t *)art_erase(&r->art, high48);
        if (leaf != NULL) {
            free_leaf(leaf);
        }
        return NULL;
    }
    return leaf;
}